

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O2

int coda_pcre2_substring_length_bynumber_8
              (pcre2_match_data_8 *match_data,uint32_t stringnumber,size_t *sizeptr)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  
  iVar2 = match_data->rc;
  if (iVar2 == -2) {
    if (stringnumber != 0) {
      return -2;
    }
    iVar2 = 0;
  }
  else if (iVar2 < 0) {
    return iVar2;
  }
  if (match_data->matchedby == '\x01') {
    if (match_data->oveccount <= stringnumber) {
      return -0x36;
    }
    if (iVar2 - 1U < stringnumber) {
      return -0x37;
    }
    uVar4 = (ulong)(stringnumber * 2);
  }
  else {
    if (match_data->code->top_bracket < stringnumber) {
      return -0x31;
    }
    if (match_data->oveccount <= stringnumber) {
      return -0x36;
    }
    uVar4 = (ulong)(stringnumber * 2);
    if (match_data->ovector[uVar4] == 0xffffffffffffffff) {
      return -0x37;
    }
  }
  uVar1 = match_data->ovector[uVar4];
  iVar2 = -0x43;
  if (((uVar1 <= match_data->subject_length) &&
      (uVar4 = match_data->ovector[uVar4 + 1], uVar4 <= match_data->subject_length)) &&
     (iVar2 = 0, sizeptr != (size_t *)0x0)) {
    sVar3 = 0;
    if (uVar1 <= uVar4) {
      sVar3 = uVar4 - uVar1;
    }
    *sizeptr = sVar3;
    return iVar2;
  }
  return iVar2;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_length_bynumber(pcre2_match_data *match_data,
  uint32_t stringnumber, PCRE2_SIZE *sizeptr)
{
PCRE2_SIZE left, right;
int count = match_data->rc;
if (count == PCRE2_ERROR_PARTIAL)
  {
  if (stringnumber > 0) return PCRE2_ERROR_PARTIAL;
  count = 0;
  }
else if (count < 0) return count;            /* Match failed */

if (match_data->matchedby != PCRE2_MATCHEDBY_DFA_INTERPRETER)
  {
  if (stringnumber > match_data->code->top_bracket)
    return PCRE2_ERROR_NOSUBSTRING;
  if (stringnumber >= match_data->oveccount)
    return PCRE2_ERROR_UNAVAILABLE;
  if (match_data->ovector[stringnumber*2] == PCRE2_UNSET)
    return PCRE2_ERROR_UNSET;
  }
else  /* Matched using pcre2_dfa_match() */
  {
  if (stringnumber >= match_data->oveccount) return PCRE2_ERROR_UNAVAILABLE;
  if (count != 0 && stringnumber >= (uint32_t)count) return PCRE2_ERROR_UNSET;
  }

left = match_data->ovector[stringnumber*2];
right = match_data->ovector[stringnumber*2+1];
if (left > match_data->subject_length || right > match_data->subject_length)
  return PCRE2_ERROR_INVALIDOFFSET;
if (sizeptr != NULL) *sizeptr = (left > right)? 0 : right - left;
return 0;
}